

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateFieldAccessor
               (FieldDescriptor *field,bool is_descriptor,Printer *printer)

{
  OneofDescriptor *pOVar1;
  bool bVar2;
  uint uVar3;
  CppType CVar4;
  Type TVar5;
  string *psVar6;
  char *pcVar7;
  FieldDescriptor *pFVar8;
  FieldDescriptor *pFVar9;
  Descriptor *pDVar10;
  EnumDescriptor *pEVar11;
  int32 value_00;
  int32 value_01;
  bool bVar12;
  string local_410;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  string local_3a8;
  allocator local_381;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  allocator local_299;
  string local_298;
  string local_278;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  allocator local_189;
  string local_188;
  string local_168;
  allocator local_141;
  string local_140;
  FieldDescriptor *local_120;
  FieldDescriptor *value;
  string local_110;
  FieldDescriptor *local_f0;
  FieldDescriptor *key;
  Descriptor *map_entry;
  string local_d8;
  string local_b8;
  string local_98;
  string local_68;
  string local_48;
  OneofDescriptor *local_28;
  OneofDescriptor *oneof;
  Printer *printer_local;
  FieldDescriptor *pFStack_10;
  bool is_descriptor_local;
  FieldDescriptor *field_local;
  
  oneof = (OneofDescriptor *)printer;
  printer_local._7_1_ = is_descriptor;
  pFStack_10 = field;
  local_28 = FieldDescriptor::containing_oneof(field);
  if (local_28 == (OneofDescriptor *)0x0) {
    GenerateFieldDocComment((Printer *)oneof,pFStack_10);
    pOVar1 = oneof;
    psVar6 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
    UnderscoresToCamelCase(&local_98,psVar6,true);
    psVar6 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
    io::Printer::Print((Printer *)pOVar1,
                       "public function get^camel_name^()\n{\n    return $this->^name^;\n}\n\n",
                       "camel_name",&local_98,"name",psVar6);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    GenerateFieldDocComment((Printer *)oneof,pFStack_10);
    pOVar1 = oneof;
    psVar6 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
    UnderscoresToCamelCase(&local_48,psVar6,true);
    uVar3 = FieldDescriptor::number(pFStack_10);
    IntToString_abi_cxx11_(&local_68,(php *)(ulong)uVar3,value_00);
    io::Printer::Print((Printer *)pOVar1,
                       "public function get^camel_name^()\n{\n    return $this->readOneof(^number^);\n}\n\n"
                       ,"camel_name",&local_48,"number",&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  GenerateFieldDocComment((Printer *)oneof,pFStack_10);
  pOVar1 = oneof;
  psVar6 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
  UnderscoresToCamelCase(&local_b8,psVar6,true);
  bVar2 = FieldDescriptor::is_repeated(pFStack_10);
  bVar12 = true;
  if (!bVar2) {
    CVar4 = FieldDescriptor::cpp_type(pFStack_10);
    bVar12 = CVar4 == CPPTYPE_MESSAGE;
  }
  pcVar7 = "$var";
  if (bVar12) {
    pcVar7 = "&$var";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,pcVar7,(allocator *)((long)&map_entry + 7));
  io::Printer::Print((Printer *)pOVar1,"public function set^camel_name^(^var^)\n{\n","camel_name",
                     &local_b8,"var",&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&map_entry + 7));
  std::__cxx11::string::~string((string *)&local_b8);
  Indent((Printer *)oneof);
  bVar12 = FieldDescriptor::is_map(pFStack_10);
  if (bVar12) {
    pDVar10 = FieldDescriptor::message_type(pFStack_10);
    key = (FieldDescriptor *)pDVar10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"key",(allocator *)((long)&value + 7));
    pFVar8 = Descriptor::FindFieldByName(pDVar10,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
    pFVar9 = key;
    local_f0 = pFVar8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"value",&local_141);
    pFVar9 = Descriptor::FindFieldByName((Descriptor *)pFVar9,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    pOVar1 = oneof;
    local_120 = pFVar9;
    pcVar7 = FieldDescriptor::type_name(local_f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,pcVar7,&local_189);
    ToUpper(&local_168,&local_188);
    pcVar7 = FieldDescriptor::type_name(local_120);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,pcVar7,&local_1d1);
    ToUpper(&local_1b0,&local_1d0);
    io::Printer::Print((Printer *)pOVar1,
                       "$arr = GPBUtil::checkMapField($var, \\Google\\Protobuf\\Internal\\GPBType::^key_type^, \\Google\\Protobuf\\Internal\\GPBType::^value_type^"
                       ,"key_type",&local_168,"value_type",&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    CVar4 = FieldDescriptor::cpp_type(local_120);
    pOVar1 = oneof;
    if (CVar4 == CPPTYPE_MESSAGE) {
      pDVar10 = FieldDescriptor::message_type(local_120);
      FullClassName<google::protobuf::Descriptor>
                (&local_218,pDVar10,(bool)(printer_local._7_1_ & 1));
      std::operator+(&local_1f8,&local_218,"::class");
      io::Printer::Print((Printer *)pOVar1,", \\^class_name^);\n","class_name",&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
    }
    else {
      CVar4 = FieldDescriptor::cpp_type(local_120);
      pOVar1 = oneof;
      if (CVar4 == CPPTYPE_ENUM) {
        pEVar11 = FieldDescriptor::enum_type(local_120);
        FullClassName<google::protobuf::EnumDescriptor>
                  (&local_258,pEVar11,(bool)(printer_local._7_1_ & 1));
        std::operator+(&local_238,&local_258,"::class");
        io::Printer::Print((Printer *)pOVar1,", \\^class_name^);\n","class_name",&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
      }
      else {
        io::Printer::Print((Printer *)oneof,");\n");
      }
    }
  }
  else {
    bVar12 = FieldDescriptor::is_repeated(pFStack_10);
    pOVar1 = oneof;
    if (bVar12) {
      pcVar7 = FieldDescriptor::type_name(pFStack_10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_298,pcVar7,&local_299);
      ToUpper(&local_278,&local_298);
      io::Printer::Print((Printer *)pOVar1,
                         "$arr = GPBUtil::checkRepeatedField($var, \\Google\\Protobuf\\Internal\\GPBType::^type^"
                         ,"type",&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
      CVar4 = FieldDescriptor::cpp_type(pFStack_10);
      pOVar1 = oneof;
      if (CVar4 == CPPTYPE_MESSAGE) {
        pDVar10 = FieldDescriptor::message_type(pFStack_10);
        FullClassName<google::protobuf::Descriptor>
                  (&local_2e0,pDVar10,(bool)(printer_local._7_1_ & 1));
        std::operator+(&local_2c0,&local_2e0,"::class");
        io::Printer::Print((Printer *)pOVar1,", \\^class_name^);\n","class_name",&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2e0);
      }
      else {
        CVar4 = FieldDescriptor::cpp_type(pFStack_10);
        pOVar1 = oneof;
        if (CVar4 == CPPTYPE_ENUM) {
          pEVar11 = FieldDescriptor::enum_type(pFStack_10);
          FullClassName<google::protobuf::EnumDescriptor>
                    (&local_320,pEVar11,(bool)(printer_local._7_1_ & 1));
          std::operator+(&local_300,&local_320,"::class");
          io::Printer::Print((Printer *)pOVar1,", \\^class_name^);\n","class_name",&local_300);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
        }
        else {
          io::Printer::Print((Printer *)oneof,");\n");
        }
      }
    }
    else {
      CVar4 = FieldDescriptor::cpp_type(pFStack_10);
      pOVar1 = oneof;
      if (CVar4 == CPPTYPE_MESSAGE) {
        pDVar10 = FieldDescriptor::message_type(pFStack_10);
        FullClassName<google::protobuf::Descriptor>
                  (&local_340,pDVar10,(bool)(printer_local._7_1_ & 1));
        io::Printer::Print((Printer *)pOVar1,"GPBUtil::checkMessage($var, \\^class_name^::class);\n"
                           ,"class_name",&local_340);
        std::__cxx11::string::~string((string *)&local_340);
      }
      else {
        CVar4 = FieldDescriptor::cpp_type(pFStack_10);
        pOVar1 = oneof;
        if (CVar4 == CPPTYPE_ENUM) {
          pEVar11 = FieldDescriptor::enum_type(pFStack_10);
          FullClassName<google::protobuf::EnumDescriptor>
                    (&local_360,pEVar11,(bool)(printer_local._7_1_ & 1));
          io::Printer::Print((Printer *)pOVar1,"GPBUtil::checkEnum($var, \\^class_name^::class);\n",
                             "class_name",&local_360);
          std::__cxx11::string::~string((string *)&local_360);
        }
        else {
          CVar4 = FieldDescriptor::cpp_type(pFStack_10);
          pOVar1 = oneof;
          if (CVar4 == CPPTYPE_STRING) {
            TVar5 = FieldDescriptor::type(pFStack_10);
            pcVar7 = "False";
            if (TVar5 == TYPE_STRING) {
              pcVar7 = "True";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_380,pcVar7,&local_381);
            io::Printer::Print((Printer *)pOVar1,"GPBUtil::checkString($var, ^utf8^);\n","utf8",
                               &local_380);
            std::__cxx11::string::~string((string *)&local_380);
            std::allocator<char>::~allocator((allocator<char> *)&local_381);
          }
          else {
            pcVar7 = FieldDescriptor::cpp_type_name(pFStack_10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3c8,pcVar7,&local_3c9);
            UnderscoresToCamelCase(&local_3a8,&local_3c8,true);
            io::Printer::Print((Printer *)pOVar1,"GPBUtil::check^type^($var);\n","type",&local_3a8);
            std::__cxx11::string::~string((string *)&local_3a8);
            std::__cxx11::string::~string((string *)&local_3c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
          }
        }
      }
    }
  }
  pOVar1 = oneof;
  if (local_28 == (OneofDescriptor *)0x0) {
    bVar12 = FieldDescriptor::is_repeated(pFStack_10);
    pOVar1 = oneof;
    if (bVar12) {
      psVar6 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
      io::Printer::Print((Printer *)pOVar1,"$this->^name^ = $arr;\n","name",psVar6);
    }
    else {
      psVar6 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
      io::Printer::Print((Printer *)pOVar1,"$this->^name^ = $var;\n","name",psVar6);
    }
  }
  else {
    uVar3 = FieldDescriptor::number(pFStack_10);
    IntToString_abi_cxx11_(&local_3f0,(php *)(ulong)uVar3,value_01);
    io::Printer::Print((Printer *)pOVar1,"$this->writeOneof(^number^, $var);\n","number",&local_3f0)
    ;
    std::__cxx11::string::~string((string *)&local_3f0);
  }
  pOVar1 = oneof;
  if ((printer_local._7_1_ & 1) != 0) {
    psVar6 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
    io::Printer::Print((Printer *)pOVar1,"$this->has_^field_name^ = true;\n","field_name",psVar6);
  }
  Outdent((Printer *)oneof);
  io::Printer::Print((Printer *)oneof,"}\n\n");
  pOVar1 = oneof;
  if ((printer_local._7_1_ & 1) != 0) {
    psVar6 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
    UnderscoresToCamelCase(&local_410,psVar6,true);
    psVar6 = FieldDescriptor::name_abi_cxx11_(pFStack_10);
    io::Printer::Print((Printer *)pOVar1,
                       "public function has^camel_name^()\n{\n    return $this->has_^field_name^;\n}\n\n"
                       ,"camel_name",&local_410,"field_name",psVar6);
    std::__cxx11::string::~string((string *)&local_410);
  }
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, bool is_descriptor,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->containing_oneof();

  // Generate getter.
  if (oneof != NULL) {
    GenerateFieldDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "number", IntToString(field->number()));
  } else {
    GenerateFieldDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name());
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field);
  printer->Print(
      "public function set^camel_name^(^var^)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true),
      "var", (field->is_repeated() ||
              field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) ?
             "&$var": "$var");

  Indent(printer);

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->FindFieldByName("key");
    const FieldDescriptor* value = map_entry->FindFieldByName("value");
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", ToUpper(key->type_name()),
        "value_type", ToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->message_type(), is_descriptor) + "::class");
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", ToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->message_type(), is_descriptor) + "::class");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print(
        "GPBUtil::checkMessage($var, \\^class_name^::class);\n",
        "class_name", FullClassName(field->message_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print(
        "GPBUtil::checkEnum($var, \\^class_name^::class);\n",
        "class_name", FullClassName(field->enum_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n",
        "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True": "False");
  } else {
    printer->Print(
        "GPBUtil::check^type^($var);\n",
        "type", UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (oneof != NULL) {
    printer->Print(
        "$this->writeOneof(^number^, $var);\n",
        "number", IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print(
        "$this->^name^ = $arr;\n",
        "name", field->name());
  } else {
    printer->Print(
        "$this->^name^ = $var;\n",
        "name", field->name());
  }

  // Set has bit for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "$this->has_^field_name^ = true;\n",
        "field_name", field->name());
  }

  Outdent(printer);

  printer->Print(
      "}\n\n");

  // Generate has method for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    return $this->has_^field_name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "field_name", field->name());
  }
}